

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void LiteScript::StateExecutor::I_VALUE_STRING(State *state,Instruction *instr)

{
  reference this;
  Object *this_00;
  String *this_01;
  String local_58;
  Instruction *local_18;
  Instruction *instr_local;
  State *state_local;
  
  state->line_num = state->line_num + 1;
  if (instr->comp_type == '\x04') {
    local_18 = instr;
    instr_local = (Instruction *)state;
    Memory::Create((Memory *)&stack0xffffffffffffffd8,(Type *)state->memory);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&state->op_lifo,(value_type *)&stack0xffffffffffffffd8);
    Variable::~Variable((Variable *)&stack0xffffffffffffffd8);
    String::String(&local_58,(local_18->comp_value).v_string);
    this = std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::back
                     ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)
                      (instr_local + 9));
    this_00 = Variable::operator->(this);
    this_01 = Object::GetData<LiteScript::String>(this_00);
    String::operator=(this_01,&local_58);
    String::~String(&local_58);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_VALUE_STRING(State& state, Instruction& instr) {
    state.line_num++;
    if (instr.comp_type != Instruction::CompType::COMP_TYPE_STRING)
        return;
    state.op_lifo.push_back(state.memory.Create(Type::STRING));
    state.op_lifo.back()->GetData<String>() = String(instr.comp_value.v_string);
}